

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_regions.cpp
# Opt level: O0

void __thiscall Am_Region_Impl::Push(Am_Region_Impl *this,Am_Region *the_region)

{
  bool bVar1;
  reference pp_Var2;
  long local_40;
  Am_Region_Impl *the_region_impl;
  Region new_region;
  Am_Region *the_region_local;
  Am_Region_Impl *this_local;
  
  new_region = (Region)the_region;
  the_region_local = &this->super_Am_Region;
  the_region_impl = (Am_Region_Impl *)XCreateRegion();
  if (new_region == (Region)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(new_region,&Am_Region::typeinfo,&typeinfo,0);
  }
  bVar1 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::empty
                    ((stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_> *)
                     (local_40 + 8));
  if (!bVar1) {
    pp_Var2 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::top
                        ((stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_> *)
                         (local_40 + 8));
    XUnionRegion(*pp_Var2,the_region_impl,the_region_impl);
  }
  bVar1 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::empty
                    (&this->stack);
  if (!bVar1) {
    pp_Var2 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::top
                        (&this->stack);
    XIntersectRegion(*pp_Var2,the_region_impl,the_region_impl);
  }
  std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::push
            (&this->stack,(value_type *)&the_region_impl);
  return;
}

Assistant:

void
Am_Region_Impl::Push(Am_Region *the_region)
{
  // Safely copy the given region into a new one
  Region new_region = XCreateRegion();
  Am_Region_Impl *the_region_impl = dynamic_cast<Am_Region_Impl *>(the_region);
  if ((the_region_impl->stack).empty() != true) {
    XUnionRegion((the_region_impl->stack).top(), new_region, new_region);
  }
  // Intersect with previous if needed
  if (stack.empty() != true) {
    XIntersectRegion(stack.top(), new_region, new_region);
  }
  // And push the new one
  stack.push(new_region);
}